

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

size_t __thiscall
c4::yml::Tree::duplicate(Tree *this,Tree *src,size_t node,size_t parent,size_t after)

{
  code *pcVar1;
  bool bVar2;
  error_flags eVar3;
  size_t sVar4;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  Tree *unaff_retaddr;
  size_t in_stack_00000008;
  size_t in_stack_00000010;
  Tree *in_stack_00000018;
  Tree *in_stack_00000020;
  size_t copy;
  char msg_3 [37];
  char msg_2 [31];
  char msg_1 [29];
  char msg [31];
  size_t in_stack_000002e8;
  size_t in_stack_000002f0;
  size_t in_stack_000002f8;
  Tree *in_stack_00000300;
  undefined4 in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe34;
  undefined4 in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe3c;
  undefined4 in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe44;
  pfn_allocate in_stack_fffffffffffffe48;
  Tree *in_stack_fffffffffffffe50;
  code *in_stack_fffffffffffffe78;
  Tree *in_stack_fffffffffffffe80;
  undefined4 local_150;
  undefined4 uStack_14c;
  undefined4 uStack_148;
  undefined4 uStack_144;
  pfn_allocate local_140;
  undefined1 local_138 [248];
  size_t local_40;
  char local_38 [24];
  long local_20;
  long local_18;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  if (in_RSI == 0) {
    local_138[0xf0] = 'c';
    local_138[0xf1] = 'h';
    local_138[0xf2] = 'e';
    local_138[0xf3] = 'c';
    local_138[0xf4] = 'k';
    local_138[0xf5] = ' ';
    local_138[0xf6] = 'f';
    local_138[0xf7] = 'a';
    local_40._0_1_ = 'i';
    local_40._1_1_ = 'l';
    local_40._2_1_ = 'e';
    local_40._3_1_ = 'd';
    local_40._4_1_ = ':';
    local_40._5_1_ = ' ';
    local_40._6_1_ = '(';
    local_40._7_1_ = 's';
    builtin_strncpy(local_38,"rc != nullptr)",0xf);
    eVar3 = get_error_flags();
    if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      trap_instruction();
    }
    pcVar1 = *(code **)(in_RDI + 0x58);
    in_stack_fffffffffffffe80 = (Tree *)(local_138 + 0xf0);
    Location::Location((Location *)in_stack_fffffffffffffe50,(char *)in_stack_fffffffffffffe48,
                       CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                       CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                       CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
    (*pcVar1)(in_stack_fffffffffffffe80,0x1f,*(undefined8 *)(in_RDI + 0x40));
    in_stack_fffffffffffffe30 = local_138._208_4_;
    in_stack_fffffffffffffe34 = local_138._212_4_;
    in_stack_fffffffffffffe38 = local_138._216_4_;
    in_stack_fffffffffffffe3c = local_138._220_4_;
    in_stack_fffffffffffffe40 = local_138._224_4_;
    in_stack_fffffffffffffe44 = local_138._228_4_;
    in_stack_fffffffffffffe48 = (pfn_allocate)local_138._232_8_;
  }
  if (local_18 == -1) {
    local_138[0xa0] = 'c';
    local_138[0xa1] = 'h';
    local_138[0xa2] = 'e';
    local_138[0xa3] = 'c';
    local_138[0xa4] = 'k';
    local_138[0xa5] = ' ';
    local_138[0xa6] = 'f';
    local_138[0xa7] = 'a';
    local_138[0xa8] = 'i';
    local_138[0xa9] = 'l';
    local_138[0xaa] = 'e';
    local_138[0xab] = 'd';
    local_138[0xac] = ':';
    local_138[0xad] = ' ';
    local_138[0xae] = '(';
    local_138[0xaf] = 'n';
    local_138[0xb0] = 'o';
    local_138[0xb1] = 'd';
    local_138[0xb2] = 'e';
    local_138[0xb3] = ' ';
    local_138[0xb4] = '!';
    local_138[0xb5] = '=';
    local_138[0xb6] = ' ';
    local_138[0xb7] = 'N';
    local_138._184_4_ = 0x29454e4f;
    local_138[0xbc] = 0;
    eVar3 = get_error_flags();
    if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      trap_instruction();
    }
    in_stack_fffffffffffffe78 = *(code **)(in_RDI + 0x58);
    Location::Location((Location *)in_stack_fffffffffffffe50,(char *)in_stack_fffffffffffffe48,
                       CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                       CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                       CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
    (*in_stack_fffffffffffffe78)(local_138 + 0xa0,0x1d,*(undefined8 *)(in_RDI + 0x40));
    in_stack_fffffffffffffe30 = local_138._128_4_;
    in_stack_fffffffffffffe34 = local_138._132_4_;
    in_stack_fffffffffffffe38 = local_138._136_4_;
    in_stack_fffffffffffffe3c = local_138._140_4_;
    in_stack_fffffffffffffe40 = local_138._144_4_;
    in_stack_fffffffffffffe44 = local_138._148_4_;
    in_stack_fffffffffffffe48 = (pfn_allocate)local_138._152_8_;
  }
  if (local_20 == -1) {
    local_138[0x50] = 'c';
    local_138[0x51] = 'h';
    local_138[0x52] = 'e';
    local_138[0x53] = 'c';
    local_138[0x54] = 'k';
    local_138[0x55] = ' ';
    local_138[0x56] = 'f';
    local_138[0x57] = 'a';
    local_138[0x58] = 'i';
    local_138[0x59] = 'l';
    local_138[0x5a] = 'e';
    local_138[0x5b] = 'd';
    local_138[0x5c] = ':';
    local_138[0x5d] = ' ';
    local_138[0x5e] = '(';
    local_138[0x5f] = 'p';
    local_138[0x60] = 'a';
    local_138[0x61] = 'r';
    local_138[0x62] = 'e';
    local_138[99] = 'n';
    local_138[100] = 't';
    local_138[0x65] = ' ';
    local_138[0x66] = '!';
    local_138[0x67] = '=';
    local_138._104_4_ = 0x4e4f4e20;
    local_138._108_2_ = 0x2945;
    local_138[0x6e] = 0;
    eVar3 = get_error_flags();
    if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      trap_instruction();
    }
    pcVar1 = *(code **)(in_RDI + 0x58);
    Location::Location((Location *)in_stack_fffffffffffffe50,(char *)in_stack_fffffffffffffe48,
                       CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                       CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                       CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
    (*pcVar1)(local_138 + 0x50,0x1f,*(undefined8 *)(in_RDI + 0x40));
    in_stack_fffffffffffffe30 = local_138._48_4_;
    in_stack_fffffffffffffe34 = local_138._52_4_;
    in_stack_fffffffffffffe38 = local_138._56_4_;
    in_stack_fffffffffffffe3c = local_138._60_4_;
    in_stack_fffffffffffffe40 = local_138._64_4_;
    in_stack_fffffffffffffe44 = local_138._68_4_;
    in_stack_fffffffffffffe48 = (pfn_allocate)local_138._72_8_;
  }
  bVar2 = is_root(in_stack_fffffffffffffe80,(size_t)in_stack_fffffffffffffe78);
  if (bVar2) {
    memcpy(local_138,"check failed: (! src->is_root(node))",0x25);
    eVar3 = get_error_flags();
    if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      trap_instruction();
    }
    pcVar1 = *(code **)(in_RDI + 0x58);
    in_stack_fffffffffffffe50 = (Tree *)local_138;
    Location::Location((Location *)in_stack_fffffffffffffe50,(char *)in_stack_fffffffffffffe48,
                       CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                       CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                       CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
    (*pcVar1)(in_stack_fffffffffffffe50,0x25,*(undefined8 *)(in_RDI + 0x40));
    in_stack_fffffffffffffe38 = local_150;
    in_stack_fffffffffffffe3c = uStack_14c;
    in_stack_fffffffffffffe40 = uStack_148;
    in_stack_fffffffffffffe44 = uStack_144;
    in_stack_fffffffffffffe48 = local_140;
  }
  sVar4 = _claim(unaff_retaddr);
  _copy_props(in_stack_fffffffffffffe50,(size_t)in_stack_fffffffffffffe48,
              (Tree *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
              CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  _set_hierarchy(in_stack_00000300,in_stack_000002f8,in_stack_000002f0,in_stack_000002e8);
  duplicate_children(in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000008,
                     (size_t)unaff_retaddr);
  return sVar4;
}

Assistant:

size_t Tree::duplicate(Tree const* src, size_t node, size_t parent, size_t after)
{
    _RYML_CB_ASSERT(m_callbacks, src != nullptr);
    _RYML_CB_ASSERT(m_callbacks, node != NONE);
    _RYML_CB_ASSERT(m_callbacks, parent != NONE);
    _RYML_CB_ASSERT(m_callbacks,  ! src->is_root(node));

    size_t copy = _claim();

    _copy_props(copy, src, node);
    _set_hierarchy(copy, parent, after);
    duplicate_children(src, node, copy, NONE);

    return copy;
}